

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.cpp
# Opt level: O2

void __thiscall CTcMake::~CTcMake(CTcMake *this)

{
  CTcMakeModule *pCVar1;
  CTcMakePath *pCVar2;
  CTcMakeDef *pCVar3;
  CTcMakeModule *this_00;
  CTcMakePath *pCVar4;
  CTcMakeDef *this_01;
  
  this_00 = this->mod_head_;
  while (this_00 != (CTcMakeModule *)0x0) {
    pCVar1 = this_00->nxt_;
    CTcMakeModule::~CTcMakeModule(this_00);
    operator_delete(this_00,0x68);
    this->mod_head_ = pCVar1;
    this_00 = pCVar1;
  }
  pCVar4 = this->inc_head_;
  while (pCVar4 != (CTcMakePath *)0x0) {
    pCVar2 = pCVar4->nxt_;
    CTcMakeStr::~CTcMakeStr(&pCVar4->path_);
    operator_delete(pCVar4,0x10);
    this->inc_head_ = pCVar2;
    pCVar4 = pCVar2;
  }
  pCVar4 = this->src_head_;
  while (pCVar4 != (CTcMakePath *)0x0) {
    pCVar2 = pCVar4->nxt_;
    CTcMakeStr::~CTcMakeStr(&pCVar4->path_);
    operator_delete(pCVar4,0x10);
    this->src_head_ = pCVar2;
    pCVar4 = pCVar2;
  }
  this_01 = this->def_head_;
  while (this_01 != (CTcMakeDef *)0x0) {
    pCVar3 = this_01->nxt_;
    CTcMakeDef::~CTcMakeDef(this_01);
    operator_delete(this_01,0x20);
    this->def_head_ = pCVar3;
    this_01 = pCVar3;
  }
  lib_free_str(this->source_charset_);
  CVmObjBigNum::term_cache();
  CTcMakeStr::~CTcMakeStr(&this->image_fname_);
  CTcMakeStr::~CTcMakeStr(&this->objdir_);
  CTcMakeStr::~CTcMakeStr(&this->symdir_);
  return;
}

Assistant:

CTcMake::~CTcMake()
{
    /* delete the modules */
    while (mod_head_ != 0)
    {
        CTcMakeModule *nxt;

        /* remember the next module */
        nxt = mod_head_->get_next();

        /* delete this one */
        delete mod_head_;

        /* move on to the next one */
        mod_head_ = nxt;
    }

    /* delete the #include path list */
    while (inc_head_ != 0)
    {
        CTcMakePath *nxt;

        /* remember the next one */
        nxt = inc_head_->get_next();

        /* delete this one */
        delete inc_head_;

        /* move on to the next one */
        inc_head_ = nxt;
    }

    /* delete the source path list */
    while (src_head_ != 0)
    {
        CTcMakePath *nxt;

        /* remember the next one */
        nxt = src_head_->get_next();

        /* delete this one */
        delete src_head_;

        /* move on to the next one */
        src_head_ = nxt;
    }

    /* delete the preprocessor symbol list */
    while (def_head_ != 0)
    {
        CTcMakeDef *nxt;

        /* remember the next one */
        nxt = def_head_->get_next();

        /* delete this one */
        delete def_head_;

        /* move on to the next one */
        def_head_ = nxt;
    }

    /* delete the source character set name */
    lib_free_str(source_charset_);

    /* delete the BigNumber cache */
    CVmObjBigNum::term_cache();
}